

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::TailCall(SQVM *this,SQClosure *closure,SQInteger parambase,SQInteger nparams)

{
  long in_RCX;
  SQClosure *in_RSI;
  SQVM *in_RDI;
  bool ret;
  SQInteger i;
  SQInteger in_stack_00000028;
  SQInteger in_stack_00000030;
  SQObjectPtr clo;
  SQInteger last_top;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  long local_58;
  SQObjectPtr local_40;
  SQInteger local_30;
  long local_28;
  bool local_1;
  
  local_30 = in_RDI->_top;
  local_28 = in_RCX;
  ::SQObjectPtr::SQObjectPtr(&local_40,in_RSI);
  if (in_RDI->ci->_root == 0) {
    for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 (SQObjectPtr *)in_RDI);
    }
    in_stack_ffffffffffffff97 =
         StartCall((SQVM *)last_top,clo.super_SQObject._unVal.pClosure,clo.super_SQObject._0_8_,
                   in_stack_00000030,in_stack_00000028,i._7_1_);
    local_1 = (bool)in_stack_ffffffffffffff97;
    if (in_RDI->_top <= local_30) {
      in_RDI->_top = local_30;
    }
  }
  else {
    Raise_Error(in_RDI,"root calls cannot invoke tailcalls");
    local_1 = false;
  }
  ::SQObjectPtr::~SQObjectPtr
            ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::TailCall(SQClosure *closure, SQInteger parambase,SQInteger nparams)
{
	SQInteger last_top = _top;
	SQObjectPtr clo = closure;
	if (ci->_root)
	{
		Raise_Error("root calls cannot invoke tailcalls");
		return false;
	}
	for (SQInteger i = 0; i < nparams; i++) STK(i) = STK(parambase + i);
	bool ret = StartCall(closure, ci->_target, nparams, _stackbase, true);
	if (last_top >= _top) {
		_top = last_top;
	}
	return ret;
}